

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

parset gettype(char *ident)

{
  int iVar1;
  parset pVar2;
  
  iVar1 = strcmp(ident,"stack");
  if (iVar1 == 0) {
    pVar2 = S;
  }
  else {
    iVar1 = strcmp(ident,"stack_enthalpies");
    if (iVar1 == 0) {
      pVar2 = S_H;
    }
    else {
      iVar1 = strcmp(ident,"hairpin");
      if (iVar1 == 0) {
        pVar2 = HP;
      }
      else {
        iVar1 = strcmp(ident,"hairpin_enthalpies");
        if (iVar1 == 0) {
          pVar2 = HP_H;
        }
        else {
          iVar1 = strcmp(ident,"bulge");
          if (iVar1 == 0) {
            pVar2 = B;
          }
          else {
            iVar1 = strcmp(ident,"bulge_enthalpies");
            if (iVar1 == 0) {
              pVar2 = B_H;
            }
            else {
              iVar1 = strcmp(ident,"interior");
              if (iVar1 == 0) {
                pVar2 = IL;
              }
              else {
                iVar1 = strcmp(ident,"interior_enthalpies");
                if (iVar1 == 0) {
                  pVar2 = IL_H;
                }
                else {
                  iVar1 = strcmp(ident,"mismatch_exterior");
                  if (iVar1 == 0) {
                    pVar2 = MME;
                  }
                  else {
                    iVar1 = strcmp(ident,"mismatch_exterior_enthalpies");
                    if (iVar1 == 0) {
                      pVar2 = MME_H;
                    }
                    else {
                      iVar1 = strcmp(ident,"mismatch_hairpin");
                      if (iVar1 == 0) {
                        pVar2 = MMH;
                      }
                      else {
                        iVar1 = strcmp(ident,"mismatch_hairpin_enthalpies");
                        if (iVar1 == 0) {
                          pVar2 = MMH_H;
                        }
                        else {
                          iVar1 = strcmp(ident,"mismatch_interior");
                          if (iVar1 == 0) {
                            pVar2 = MMI;
                          }
                          else {
                            iVar1 = strcmp(ident,"mismatch_interior_enthalpies");
                            if (iVar1 == 0) {
                              pVar2 = MMI_H;
                            }
                            else {
                              iVar1 = strcmp(ident,"mismatch_interior_1n");
                              if (iVar1 == 0) {
                                pVar2 = MMI1N;
                              }
                              else {
                                iVar1 = strcmp(ident,"mismatch_interior_1n_enthalpies");
                                if (iVar1 == 0) {
                                  pVar2 = MMI1N_H;
                                }
                                else {
                                  iVar1 = strcmp(ident,"mismatch_interior_23");
                                  if (iVar1 == 0) {
                                    pVar2 = MMI23;
                                  }
                                  else {
                                    iVar1 = strcmp(ident,"mismatch_interior_23_enthalpies");
                                    if (iVar1 == 0) {
                                      pVar2 = MMI23_H;
                                    }
                                    else {
                                      iVar1 = strcmp(ident,"mismatch_multi");
                                      if (iVar1 == 0) {
                                        pVar2 = MMM;
                                      }
                                      else {
                                        iVar1 = strcmp(ident,"mismatch_multi_enthalpies");
                                        if (iVar1 == 0) {
                                          pVar2 = MMM_H;
                                        }
                                        else {
                                          iVar1 = strcmp(ident,"int11");
                                          if (iVar1 == 0) {
                                            pVar2 = INT11;
                                          }
                                          else {
                                            iVar1 = strcmp(ident,"int11_enthalpies");
                                            if (iVar1 == 0) {
                                              pVar2 = INT11_H;
                                            }
                                            else {
                                              iVar1 = strcmp(ident,"int21");
                                              if (iVar1 == 0) {
                                                pVar2 = INT21;
                                              }
                                              else {
                                                iVar1 = strcmp(ident,"int21_enthalpies");
                                                if (iVar1 == 0) {
                                                  pVar2 = INT21_H;
                                                }
                                                else {
                                                  iVar1 = strcmp(ident,"int22");
                                                  if (iVar1 == 0) {
                                                    pVar2 = INT22;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(ident,"int22_enthalpies");
                                                    if (iVar1 == 0) {
                                                      pVar2 = INT22_H;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(ident,"dangle5");
                                                      if (iVar1 == 0) {
                                                        pVar2 = D5;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(ident,"dangle5_enthalpies");
                                                        if (iVar1 == 0) {
                                                          pVar2 = D5_H;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(ident,"dangle3");
                                                          if (iVar1 == 0) {
                                                            pVar2 = D3;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(ident,
                                                  "dangle3_enthalpies");
                                                  if (iVar1 == 0) {
                                                    pVar2 = D3_H;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(ident,"ML_params");
                                                    if (iVar1 == 0) {
                                                      pVar2 = ML;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(ident,"NINIO");
                                                      if (iVar1 == 0) {
                                                        pVar2 = NIN;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(ident,"Triloops");
                                                        if (iVar1 == 0) {
                                                          pVar2 = TRI;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(ident,"Tetraloops");
                                                          if (iVar1 == 0) {
                                                            pVar2 = TL;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(ident,"Hexaloops");
                                                            if (iVar1 == 0) {
                                                              pVar2 = HEX;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(ident,"Misc");
                                                              if (iVar1 == 0) {
                                                                pVar2 = MISC;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(ident,"END");
                                                                pVar2 = -(uint)(iVar1 != 0);
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pVar2;
}

Assistant:

parset
gettype(const char *ident)
{
  if (strcmp(ident, "stack") == 0)
    return S;
  else if (strcmp(ident, "stack_enthalpies") == 0)
    return S_H;
  else if (strcmp(ident, "hairpin") == 0)
    return HP;
  else if (strcmp(ident, "hairpin_enthalpies") == 0)
    return HP_H;
  else if (strcmp(ident, "bulge") == 0)
    return B;
  else if (strcmp(ident, "bulge_enthalpies") == 0)
    return B_H;
  else if (strcmp(ident, "interior") == 0)
    return IL;
  else if (strcmp(ident, "interior_enthalpies") == 0)
    return IL_H;
  else if (strcmp(ident, "mismatch_exterior") == 0)
    return MME;
  else if (strcmp(ident, "mismatch_exterior_enthalpies") == 0)
    return MME_H;
  else if (strcmp(ident, "mismatch_hairpin") == 0)
    return MMH;
  else if (strcmp(ident, "mismatch_hairpin_enthalpies") == 0)
    return MMH_H;
  else if (strcmp(ident, "mismatch_interior") == 0)
    return MMI;
  else if (strcmp(ident, "mismatch_interior_enthalpies") == 0)
    return MMI_H;
  else if (strcmp(ident, "mismatch_interior_1n") == 0)
    return MMI1N;
  else if (strcmp(ident, "mismatch_interior_1n_enthalpies") == 0)
    return MMI1N_H;
  else if (strcmp(ident, "mismatch_interior_23") == 0)
    return MMI23;
  else if (strcmp(ident, "mismatch_interior_23_enthalpies") == 0)
    return MMI23_H;
  else if (strcmp(ident, "mismatch_multi") == 0)
    return MMM;
  else if (strcmp(ident, "mismatch_multi_enthalpies") == 0)
    return MMM_H;
  else if (strcmp(ident, "int11") == 0)
    return INT11;
  else if (strcmp(ident, "int11_enthalpies") == 0)
    return INT11_H;
  else if (strcmp(ident, "int21") == 0)
    return INT21;
  else if (strcmp(ident, "int21_enthalpies") == 0)
    return INT21_H;
  else if (strcmp(ident, "int22") == 0)
    return INT22;
  else if (strcmp(ident, "int22_enthalpies") == 0)
    return INT22_H;
  else if (strcmp(ident, "dangle5") == 0)
    return D5;
  else if (strcmp(ident, "dangle5_enthalpies") == 0)
    return D5_H;
  else if (strcmp(ident, "dangle3") == 0)
    return D3;
  else if (strcmp(ident, "dangle3_enthalpies") == 0)
    return D3_H;
  else if (strcmp(ident, "ML_params") == 0)
    return ML;
  else if (strcmp(ident, "NINIO") == 0)
    return NIN;
  else if (strcmp(ident, "Triloops") == 0)
    return TRI;
  else if (strcmp(ident, "Tetraloops") == 0)
    return TL;
  else if (strcmp(ident, "Hexaloops") == 0)
    return HEX;
  else if (strcmp(ident, "Misc") == 0)
    return MISC;
  else if (strcmp(ident, "END") == 0)
    return QUIT;
  else
    return UNKNOWN;
}